

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.hh
# Opt level: O2

void __thiscall SatLookAngles::updateTimeAndPositions(SatLookAngles *this)

{
  pointer ppVar1;
  DateTime DVar2;
  CoordTopocentric *pCVar3;
  CoordTopocentric local_368;
  Eci pos;
  SGP4 model;
  
  DVar2 = DateTime::Now(true);
  (this->_time).m_encoded = DVar2.m_encoded;
  ppVar1 = (this->_sats).
           super__Vector_base<std::pair<Tle,_CoordTopocentric>,_std::allocator<std::pair<Tle,_CoordTopocentric>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pCVar3 = &((this->_sats).
                  super__Vector_base<std::pair<Tle,_CoordTopocentric>,_std::allocator<std::pair<Tle,_CoordTopocentric>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->second;
      (pointer)&pCVar3[-7].elevation != ppVar1; pCVar3 = (CoordTopocentric *)&pCVar3[7].range_rate)
  {
    SGP4::SGP4(&model,(Tle *)&pCVar3[-7].elevation);
    SGP4::FindPosition(&pos,&model,&this->_time);
    Observer::GetLookAngle(&local_368,&this->_me,&pos);
    if (pCVar3 != &local_368) {
      pCVar3->azimuth = local_368.azimuth;
      pCVar3->elevation = local_368.elevation;
      pCVar3->range = local_368.range;
      pCVar3->range_rate = local_368.range_rate;
    }
  }
  return;
}

Assistant:

void updateTimeAndPositions() {
    _time = DateTime::Now(true);
    for (auto &sat : _sats) {
      const auto model = SGP4(sat.first);
      const auto pos = model.FindPosition(_time);
      sat.second = _me.GetLookAngle(pos);
    }
  }